

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_sectors.cxx
# Opt level: O2

void __thiscall
read_sector_v13::operator()(read_sector_v13 *this,sector_data **_sector,xr_reader *r)

{
  uint __line;
  sector_data *value;
  size_t sVar1;
  char *__assertion;
  
  value = (sector_data *)operator_new(0x20);
  (value->portals).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (value->portals).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->portals).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_sector = value;
  sVar1 = xray_re::xr_reader::r_chunk<unsigned_int>(r,2,(uint *)value);
  if (sVar1 == 0) {
    __assertion = "0";
    __line = 0x22;
  }
  else {
    sVar1 = xray_re::xr_reader::find_chunk(r,1);
    if ((sVar1 & 1) == 0) {
      xray_re::xr_reader::r_seq<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                (r,sVar1 >> 1,&value->portals);
      return;
    }
    __assertion = "size == 0 || (size % sizeof(uint16_t) == 0)";
    __line = 0x24;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_sectors.cxx"
                ,__line,"void read_sector_v13::operator()(sector_data *&, xr_reader &) const");
}

Assistant:

void operator()(sector_data*& _sector, xr_reader& r) const {
	sector_data* sector = new sector_data;
	_sector = sector;
	if (!r.r_chunk(FSP_ROOT, sector->root))
		xr_not_expected();
	size_t size = r.find_chunk(FSP_PORTALS);
	xr_assert(size == 0 || (size % sizeof(uint16_t) == 0));
	r.r_seq(size/sizeof(uint16_t), sector->portals);
}